

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O3

void __thiscall BamTools::Internal::BamToolsIndex::WriteBlock(BamToolsIndex *this,BtiBlock *block)

{
  IBamIODevice *pIVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  BamException *this_00;
  int32_t startPosition;
  int32_t maxEndPosition;
  int64_t startOffset;
  uint local_78;
  uint local_74;
  ulong local_70;
  string local_68;
  string local_48;
  
  local_74 = block->MaxEndPosition;
  local_70 = block->StartOffset;
  local_78 = block->StartPosition;
  if (this->m_isBigEndian == true) {
    local_74 = local_74 << 0x18 | (int)local_74 >> 0x18 | (local_74 & 0xff00) << 8 |
               local_74 >> 8 & 0xff00;
    local_70 = local_70 << 0x38 | (long)local_70 >> 0x38 | (local_70 & 0xff00) << 0x28 |
               (ulong)((uint)local_70 & 0xff000000) << 8 | (local_70 & 0xff0000) << 0x18 |
               local_70 >> 0x28 & 0xff00 |
               local_70 >> 0x18 & 0xff0000 | (ulong)((uint)(local_70 >> 8) & 0xff000000);
    local_78 = local_78 << 0x18 | (int)local_78 >> 0x18 | (local_78 & 0xff00) << 8 |
               local_78 >> 8 & 0xff00;
  }
  pIVar1 = (this->m_resources).Device;
  iVar2 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&local_74,4);
  pIVar1 = (this->m_resources).Device;
  iVar3 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&local_70,8);
  pIVar1 = (this->m_resources).Device;
  iVar4 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&local_78,4);
  if (CONCAT44(extraout_var_01,iVar4) +
      CONCAT44(extraout_var_00,iVar3) + CONCAT44(extraout_var,iVar2) == 0x10) {
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"BamToolsIndex::WriteBlock","");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"could not write BTI block","");
  BamException::BamException(this_00,&local_68,&local_48);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamToolsIndex::WriteBlock(const BtiBlock& block)
{

    // copy entry data
    int32_t maxEndPosition = block.MaxEndPosition;
    int64_t startOffset = block.StartOffset;
    int32_t startPosition = block.StartPosition;

    // swap endian-ness if necessary
    if (m_isBigEndian) {
        SwapEndian_32(maxEndPosition);
        SwapEndian_64(startOffset);
        SwapEndian_32(startPosition);
    }

    // write the reference index entry
    int64_t numBytesWritten = 0;
    numBytesWritten +=
        m_resources.Device->Write((const char*)&maxEndPosition, sizeof(maxEndPosition));
    numBytesWritten += m_resources.Device->Write((const char*)&startOffset, sizeof(startOffset));
    numBytesWritten +=
        m_resources.Device->Write((const char*)&startPosition, sizeof(startPosition));

    // check block written ok
    const int expectedBytes = sizeof(maxEndPosition) + sizeof(startOffset) + sizeof(startPosition);
    if (numBytesWritten != expectedBytes)
        throw BamException("BamToolsIndex::WriteBlock", "could not write BTI block");
}